

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

_Bool bitset_container_is_subset(bitset_container_t *container1,bitset_container_t *container2)

{
  ulong uVar1;
  
  if ((container1->cardinality == -1) ||
     (container2->cardinality == -1 || container1->cardinality <= container2->cardinality)) {
    uVar1 = 0xffffffffffffffff;
    while ((container1->words[uVar1 + 1] & ~container2->words[uVar1 + 1]) == 0) {
      uVar1 = uVar1 + 1;
      if (uVar1 == 0x3ff) {
        return 0x3fe < uVar1;
      }
    }
  }
  return false;
}

Assistant:

bool bitset_container_is_subset(const bitset_container_t *container1,
                          const bitset_container_t *container2) {
    if((container1->cardinality != BITSET_UNKNOWN_CARDINALITY) && (container2->cardinality != BITSET_UNKNOWN_CARDINALITY)) {
        if(container1->cardinality > container2->cardinality) {
            return false;
        }
    }
    for(int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
		if((container1->words[i] & container2->words[i]) != container1->words[i]) {
			return false;
		}
	}
	return true;
}